

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

iterator __thiscall Map::DelItem(Map *this,iterator it,Character *from)

{
  Character *this_00;
  bool bVar1;
  _List_node_base *p_Var2;
  PacketBuilder builder;
  PacketBuilder local_60;
  
  PacketBuilder::PacketBuilder(&local_60,PACKET_ITEM,PACKET_REMOVE,2);
  PacketBuilder::AddShort(&local_60,(int)*(short *)&(it._M_node[1]._M_next)->_M_next);
  for (p_Var2 = (this->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->characters; p_Var2 = p_Var2->_M_next) {
    this_00 = (Character *)p_Var2[1]._M_next;
    if ((from == (Character *)0x0) || (this_00 != from)) {
      bVar1 = Character::InRange(this_00,(Map_Item *)it._M_node[1]._M_next);
      if (bVar1) {
        Character::Send(this_00,&local_60);
      }
    }
  }
  p_Var2 = (it._M_node)->_M_next;
  std::__cxx11::list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::
  _M_erase(&this->items,it);
  PacketBuilder::~PacketBuilder(&local_60);
  return (iterator)p_Var2;
}

Assistant:

std::list<std::shared_ptr<Map_Item>>::iterator Map::DelItem(std::list<std::shared_ptr<Map_Item>>::iterator it, Character *from)
{
	PacketBuilder builder(PACKET_ITEM, PACKET_REMOVE, 2);
	builder.AddShort((*it)->uid);

	UTIL_FOREACH(this->characters, character)
	{
		if ((from && character == from) || !character->InRange(**it))
		{
			continue;
		}

		character->Send(builder);
	}

	return this->items.erase(it);
}